

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O0

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>>::
applyHouseholderOnTheRight<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,1,true>,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *this,
          Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>
          *essential,Scalar *tau,Scalar *workspace)

{
  Index IVar1;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *this_00;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
  *other;
  MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>_>
  *this_01;
  Stride<0,_0> *in_RCX;
  EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *in_RDI;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false> right;
  Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  Stride<0,_0> *in_stack_fffffffffffffd28;
  Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> *in_stack_fffffffffffffd40;
  Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true> *in_stack_fffffffffffffd58;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>
  *in_stack_fffffffffffffd60;
  Scalar *in_stack_fffffffffffffd68;
  DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_>
  *in_stack_fffffffffffffd70;
  CoeffBasedProduct<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>,_256>
  *in_stack_fffffffffffffdb8;
  NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_Eigen::MatrixBase>
  *in_stack_fffffffffffffdc0;
  
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::cols
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *)
                     0x2e6d19);
  if (IVar1 == 1) {
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::operator*=
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  }
  else {
    this_00 = (DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *)
              EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::rows
                        ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_>
                          *)0x2e6d6a);
    Stride<0,_0>::Stride(in_RCX);
    Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>::Map
              (in_stack_fffffffffffffd40,(PointerArgType)this_00,(Index)in_RCX,
               in_stack_fffffffffffffd28);
    other = (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
             *)EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::derived
                         (in_RDI);
    this_01 = (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>_>
               *)EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::rows
                           ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_>
                             *)0x2e6db4);
    EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::cols
              ((EigenBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>_> *)
               0x2e6dc3);
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>::Block
              (in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,(Index)in_RDI,(Index)this_01,
               (Index)other,(Index)this_00);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
    ::conjugate((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                 *)0x2e6df7);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>,2,-1,false>>::
    operator*(this_01,other);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>::noalias
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_stack_fffffffffffffd28);
    NoAlias<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>,Eigen::MatrixBase>::
    operator=((NoAlias<Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::MatrixBase>
               *)in_RCX,
              (MatrixBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>,_6>_>
               *)in_stack_fffffffffffffd28);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::col
              (this_00,(Index)in_RCX);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)in_RDI,
               (MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,_1,_true>_>
                *)this_01);
    Eigen::operator*((Scalar *)this_00,(StorageBaseType *)in_RCX);
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>_>::col
              (this_00,(Index)in_RCX);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>,2,1,true>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,_1,_true>_>
                *)in_RDI,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)this_01);
    Eigen::operator*((Scalar *)this_00,(StorageBaseType *)in_RCX);
    DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,_-1,_1,_false>_>
    ::transpose((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>
                 *)this_00);
    MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,2,1,0,2,1>,0,Eigen::Stride<0,0>>const>>
    ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                 *)this_01,
                (MatrixBase<Eigen::Transpose<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_1,_true>,__1,_1,_false>_>_>
                 *)other);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,_-1,_true>,_2,_-1,_false>_>
    ::noalias((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_2,__1,_true>,_2,__1,_false>_>
               *)in_stack_fffffffffffffd28);
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,2,-1,true>,2,-1,false>,Eigen::MatrixBase>
    ::operator-=(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential.conjugate();
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.transpose();
  }
}